

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LogicalAndLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicaland(NeuralNetworkLayer *this)

{
  LogicalAndLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x357) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x357;
    this_00 = (LogicalAndLayerParams *)operator_new(0x18);
    LogicalAndLayerParams::LogicalAndLayerParams(this_00);
    (this->layer_).logicaland_ = this_00;
  }
  return (LogicalAndLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalAndLayerParams* NeuralNetworkLayer::mutable_logicaland() {
  if (!has_logicaland()) {
    clear_layer();
    set_has_logicaland();
    layer_.logicaland_ = new ::CoreML::Specification::LogicalAndLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalAnd)
  return layer_.logicaland_;
}